

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

string * __thiscall
baryonyx::to_string_abi_cxx11_
          (string *__return_storage_ptr__,baryonyx *this,
          tuple<double,_baryonyx::show_size_type> *mem)

{
  int iVar1;
  char *pcVar2;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined8 local_18 [2];
  
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    local_18[0] = *(undefined8 *)(this + 8);
    this_00 = "{:.2f} KB";
  }
  else if (iVar1 == 1) {
    local_18[0] = *(undefined8 *)(this + 8);
    this_00 = "{:.2f} MB";
  }
  else {
    if (iVar1 != 0) {
      local_18[0] = *(undefined8 *)(this + 8);
      this_00 = "{:.2f} B";
      pcVar2 = (char *)0x8;
      goto LAB_005ec750;
    }
    local_18[0] = *(undefined8 *)(this + 8);
    this_00 = "{:.2f} GB";
  }
  pcVar2 = (char *)0x9;
LAB_005ec750:
  format_str.size_ = 10;
  format_str.data_ = pcVar2;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_18;
  ::fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)this_00,format_str,args);
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string(std::tuple<double, show_size_type> mem)
{
    switch (std::get<1>(mem)) {
    case show_size_type::GB:
        return fmt::format("{:.2f} GB", std::get<0>(mem));
    case show_size_type::MB:
        return fmt::format("{:.2f} MB", std::get<0>(mem));
    case show_size_type::KB:
        return fmt::format("{:.2f} KB", std::get<0>(mem));
    default:
        return fmt::format("{:.2f} B", std::get<0>(mem));
    }
}